

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O2

void math::internal::matrix_svd_clear_super_entry<double>
               (int rows,int cols,double *mat_b,double *mat_q,int row_index,double *epsilon)

{
  undefined4 in_register_00000034;
  int iVar1;
  long lVar2;
  double dVar3;
  double local_80;
  double givens_c;
  double *local_70;
  double *local_68;
  double *local_60;
  undefined8 local_58;
  double local_50;
  double givens_s;
  int local_3c;
  int local_38;
  int local_34;
  
  local_58 = CONCAT44(in_register_00000034,cols);
  local_38 = cols + 1;
  lVar2 = (long)row_index;
  givens_c = (double)(long)cols;
  givens_s = (double)(mat_b + row_index * cols);
  iVar1 = (row_index + 1) * local_38;
  local_70 = epsilon;
  local_68 = mat_q;
  local_60 = mat_b;
  local_3c = rows;
  local_34 = row_index;
  while( true ) {
    lVar2 = lVar2 + 1;
    if ((long)givens_c <= lVar2) {
      return;
    }
    local_50 = *(double *)((long)givens_s + lVar2 * 8);
    if ((0.0 - *local_70 <= local_50) && (local_50 <= *local_70)) break;
    local_80 = local_60[iVar1];
    dVar3 = SQRT(local_50 * local_50 + local_80 * local_80);
    dVar3 = (double)((ulong)-dVar3 & -(ulong)(local_80 < 0.0) |
                    ~-(ulong)(local_80 < 0.0) & (ulong)dVar3);
    local_80 = local_80 / dVar3;
    local_50 = local_50 / dVar3;
    matrix_apply_givens_row<double>(local_60,cols,cols,row_index,(int)lVar2,&local_80,&local_50);
    matrix_apply_givens_column<double>
              (local_68,local_3c,cols,row_index,(int)lVar2,&local_80,&local_50);
    iVar1 = iVar1 + local_38;
  }
  *(undefined8 *)((long)givens_s + lVar2 * 8) = 0;
  return;
}

Assistant:

void
matrix_svd_clear_super_entry(int rows, int cols, T* mat_b, T* mat_q,
    int row_index, T const& epsilon)
{
    for (int i = row_index + 1; i < cols; ++i)
    {
        if (MATH_EPSILON_EQ(mat_b[row_index * cols + i], T(0), epsilon))
        {
            mat_b[row_index * cols + i] = T(0);
            break;
        }

        T norm = MATH_POW2(mat_b[row_index * cols + i])
            + MATH_POW2(mat_b[i * cols + i]);
        norm = std::sqrt(norm) * MATH_SIGN(mat_b[i * cols + i]);

        T givens_c = mat_b[i * cols + i] / norm;
        T givens_s = mat_b[row_index * cols + i] / norm;
        matrix_apply_givens_row(mat_b, cols, cols, row_index,
            i, givens_c, givens_s);
        matrix_apply_givens_column(mat_q, rows, cols, row_index,
            i, givens_c, givens_s);
    }
}